

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxgeometsc.hpp
# Opt level: O0

void __thiscall
soplex::
SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::scale(SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *lp,bool persistent)

{
  type_conflict5 tVar1;
  Verbosity VVar2;
  element_type *this_00;
  SPxOut *_spxout;
  byte in_DL;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  long *in_RDI;
  Verbosity old_verbosity_7;
  Verbosity old_verbosity_6;
  DataArray<int> *rowscaleExp;
  DataArray<int> *colscaleExp;
  Verbosity old_verbosity_5;
  Verbosity old_verbosity_4;
  int count;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p1prev;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p0prev;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p0;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  colscale;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  rowscale;
  Verbosity old_verbosity_3;
  Verbosity old_verbosity_2;
  bool geoscale;
  Verbosity old_verbosity_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p1start;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p0start;
  bool colFirst;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rowratio;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  colratio;
  Verbosity old_verbosity;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined4 in_stack_ffffffffffffe6c8;
  int in_stack_ffffffffffffe6cc;
  cpp_dec_float<200U,_int,_void> *in_stack_ffffffffffffe6d0;
  __normal_iterator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_*,_std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
  in_stack_ffffffffffffe6d8;
  __normal_iterator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_*,_std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
  in_stack_ffffffffffffe6e0;
  size_type in_stack_ffffffffffffe6e8;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *in_stack_ffffffffffffe6f0;
  type_conflict5 local_1852;
  type_conflict5 local_1832;
  DataArray<int> *in_stack_ffffffffffffe7d0;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *in_stack_ffffffffffffe7d8;
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe7e0;
  undefined1 *local_1818;
  undefined1 *local_17f8;
  undefined1 local_1730 [128];
  undefined1 local_16b0 [128];
  undefined1 local_1630 [104];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffea38;
  DataArray<int> *in_stack_ffffffffffffea40;
  DataArray<int> *in_stack_ffffffffffffea48;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *in_stack_ffffffffffffea50;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *in_stack_ffffffffffffea58;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffea60;
  undefined4 local_1530;
  Verbosity local_152c;
  undefined1 local_1528 [128];
  undefined1 local_14a8 [128];
  undefined1 local_1428 [128];
  undefined1 local_13a8 [104];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffecc0;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *in_stack_ffffffffffffecc8;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *in_stack_ffffffffffffecd0;
  undefined4 in_stack_ffffffffffffecd8;
  undefined4 in_stack_ffffffffffffecdc;
  undefined1 local_1320 [128];
  undefined8 local_12a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1298;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1290;
  undefined8 local_1288;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1280;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1278;
  long local_1270;
  long local_1268;
  undefined4 local_125c;
  Verbosity local_1258;
  undefined1 local_1254 [128];
  undefined1 local_11d4 [128];
  undefined1 local_1154 [128];
  DataArray<int> local_10d4 [5];
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_1054 [5];
  undefined1 local_fd4 [128];
  undefined4 local_f54;
  Verbosity local_f50;
  undefined1 local_f4c [128];
  undefined1 local_ecc [128];
  undefined1 local_e4c [128];
  undefined1 local_dcc [128];
  undefined1 local_d4c [128];
  undefined1 local_ccc [128];
  undefined1 local_c4c [128];
  undefined1 local_bcc [128];
  int local_b4c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b48;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ac8;
  undefined8 local_a48;
  undefined1 local_a40 [128];
  undefined8 local_9c0;
  undefined1 local_9b4 [132];
  undefined8 local_930;
  undefined1 local_928 [160];
  undefined8 local_888;
  undefined1 local_880 [156];
  undefined4 local_7e4;
  Verbosity local_7e0 [3];
  type_conflict5 local_7d1;
  undefined1 local_7d0 [128];
  undefined1 local_750 [128];
  undefined1 local_6d0 [128];
  undefined1 local_650 [128];
  undefined4 local_5d0;
  Verbosity local_5cc;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_548;
  byte local_4c5;
  Real local_4a8;
  undefined1 local_49c [128];
  undefined1 local_41c [128];
  undefined1 local_39c [128];
  undefined4 local_31c;
  Verbosity local_318;
  byte local_311;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_310;
  undefined8 local_300;
  Real *local_2f8;
  undefined1 *local_2f0;
  undefined8 local_2e8;
  undefined8 *local_2e0;
  undefined1 *local_2d8;
  undefined8 local_2d0;
  undefined8 *local_2c8;
  undefined1 *local_2c0;
  undefined8 local_2b8;
  undefined8 *local_2b0;
  undefined1 *local_2a8;
  undefined8 local_2a0;
  undefined8 *local_298;
  undefined1 *local_290;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_288;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_258;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_250;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_248;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_180;
  undefined1 *local_178;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  undefined1 *local_168;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_160;
  undefined1 *local_158;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  undefined1 *local_148;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_140;
  undefined1 *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  undefined8 *local_128;
  undefined8 *local_120;
  undefined8 *local_118;
  undefined8 *local_110;
  Real *local_108;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_f9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d0;
  undefined1 *local_c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  undefined1 *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined1 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  DataArray<int> *local_28;
  DataArray<int> *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  DataArray<int> *local_8;
  
  local_311 = in_DL & 1;
  local_310 = in_RSI;
  if ((in_RDI[5] != 0) && (VVar2 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 2 < (int)VVar2)) {
    local_318 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
    local_31c = 3;
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_31c);
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                       (char *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                       (char *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                       (char *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                       (_func_ostream_ptr_ostream_ptr *)
                       CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_318);
  }
  (**(code **)*in_RDI)(in_RDI,local_310);
  (**(code **)(*in_RDI + 0x198))(local_39c,in_RDI,local_310);
  (**(code **)(*in_RDI + 0x1a0))(local_41c,in_RDI,local_310);
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tolerances((SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
  this_00 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x752d85);
  local_4a8 = Tolerances::epsilon(this_00);
  local_2f0 = local_49c;
  local_2f8 = &local_4a8;
  local_300 = 0;
  local_108 = local_2f8;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&(in_stack_ffffffffffffe6e0._M_current)->m_backend,
             (double)in_stack_ffffffffffffe6d8._M_current,in_stack_ffffffffffffe6d0);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x752e14);
  local_4c5 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x752e29);
  local_288 = &local_548;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffe6d0);
  local_280 = &local_5c8;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffe6d0);
  if ((local_4c5 & 1) == 0) {
    local_150 = &local_548;
    local_158 = local_41c;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_stack_ffffffffffffe6d0,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
    local_160 = &local_5c8;
    local_168 = local_39c;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_stack_ffffffffffffe6d0,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
  }
  else {
    local_130 = &local_548;
    local_138 = local_39c;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_stack_ffffffffffffe6d0,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
    local_140 = &local_5c8;
    local_148 = local_41c;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_stack_ffffffffffffe6d0,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
  }
  if ((in_RDI[5] != 0) && (VVar2 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 3 < (int)VVar2)) {
    local_5cc = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
    local_5d0 = 4;
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_5d0);
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                       (char *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                       (char *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
    (*(local_310->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[3])(local_650,local_310,1);
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                       (char *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
    (*(local_310->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[4])(local_6d0,local_310,1);
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                       (char *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
    local_270 = local_750;
    local_278 = local_39c;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_ffffffffffffe6d0,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                       (char *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
    local_260 = local_7d0;
    local_268 = local_41c;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_ffffffffffffe6d0,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                       (_func_ostream_ptr_ostream_ptr *)
                       CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_5cc);
  }
  local_7d1 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x75319a);
  if (!local_7d1) {
    if ((in_RDI[5] != 0) && (VVar2 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 3 < (int)VVar2)) {
      local_7e0[2] = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
      local_7e0[1] = 4;
      (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],local_7e0 + 1);
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                         (char *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                         (_func_ostream_ptr_ostream_ptr *)
                         CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
      (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],local_7e0 + 2);
    }
    if ((*(byte *)(in_RDI + 8) & 1) == 0) {
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setScalingInfo(local_310,true);
      return;
    }
    if ((in_RDI[5] != 0) && (VVar2 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 3 < (int)VVar2)) {
      local_7e0[0] = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
      local_7e4 = 4;
      (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_7e4);
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                         (char *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                         (_func_ostream_ptr_ostream_ptr *)
                         CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
      (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],local_7e0);
    }
  }
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x75334f);
  local_888 = 0x3ff0000000000000;
  local_2d8 = local_880;
  local_2e0 = &local_888;
  local_2e8 = 0;
  local_110 = local_2e0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&(in_stack_ffffffffffffe6e0._M_current)->m_backend,
             (double)in_stack_ffffffffffffe6d8._M_current,in_stack_ffffffffffffe6d0);
  std::
  allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocator((allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x7533e1);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::vector(in_stack_ffffffffffffe6f0,in_stack_ffffffffffffe6e8,in_stack_ffffffffffffe6e0._M_current,
           (allocator_type *)in_stack_ffffffffffffe6d8._M_current);
  std::
  allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~allocator((allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x753415);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x753422);
  local_930 = 0x3ff0000000000000;
  local_2c0 = local_928;
  local_2c8 = &local_930;
  local_2d0 = 0;
  local_118 = local_2c8;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&(in_stack_ffffffffffffe6e0._M_current)->m_backend,
             (double)in_stack_ffffffffffffe6d8._M_current,in_stack_ffffffffffffe6d0);
  std::
  allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocator((allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x7534c0);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::vector(in_stack_ffffffffffffe6f0,in_stack_ffffffffffffe6e8,in_stack_ffffffffffffe6e0._M_current,
           (allocator_type *)in_stack_ffffffffffffe6d8._M_current);
  std::
  allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~allocator((allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x7534f4);
  local_9c0 = 0;
  local_2a8 = local_9b4;
  local_2b0 = &local_9c0;
  local_2b8 = 0;
  local_120 = local_2b0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&(in_stack_ffffffffffffe6e0._M_current)->m_backend,
             (double)in_stack_ffffffffffffe6d8._M_current,in_stack_ffffffffffffe6d0);
  local_a48 = 0;
  local_290 = local_a40;
  local_298 = &local_a48;
  local_2a0 = 0;
  local_128 = local_298;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&(in_stack_ffffffffffffe6e0._M_current)->m_backend,
             (double)in_stack_ffffffffffffe6d8._M_current,in_stack_ffffffffffffe6d0);
  if ((local_7d1 & 1U) != 0) {
    local_250 = &local_ac8;
    local_258 = &local_548;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_ffffffffffffe6d0,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
    local_240 = &local_b48;
    local_248 = &local_5c8;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_ffffffffffffe6d0,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
    for (local_b4c = 0; local_b4c < *(int *)((long)in_RDI + 0x44); local_b4c = local_b4c + 1) {
      if ((local_4c5 & 1) == 0) {
        LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::rowSet(&local_310->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                );
        local_210 = local_e4c;
        local_218 = local_49c;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  (in_stack_ffffffffffffe6d0,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
        computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)CONCAT44(in_stack_ffffffffffffecdc,in_stack_ffffffffffffecd8),
                   in_stack_ffffffffffffecd0,in_stack_ffffffffffffecc8,in_stack_ffffffffffffecc0);
        local_1b0 = local_9b4;
        local_1b8 = local_dcc;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (in_stack_ffffffffffffe6d0,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
        LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::colSet(&local_310->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                );
        local_200 = local_f4c;
        local_208 = local_49c;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  (in_stack_ffffffffffffe6d0,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
        computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)CONCAT44(in_stack_ffffffffffffecdc,in_stack_ffffffffffffecd8),
                   in_stack_ffffffffffffecd0,in_stack_ffffffffffffecc8,in_stack_ffffffffffffecc0);
        local_1c0 = local_a40;
        local_1c8 = local_ecc;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (in_stack_ffffffffffffe6d0,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
      }
      else {
        LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::colSet(&local_310->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                );
        local_230 = local_c4c;
        local_238 = local_49c;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  (in_stack_ffffffffffffe6d0,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
        computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)CONCAT44(in_stack_ffffffffffffecdc,in_stack_ffffffffffffecd8),
                   in_stack_ffffffffffffecd0,in_stack_ffffffffffffecc8,in_stack_ffffffffffffecc0);
        local_190 = local_9b4;
        local_198 = local_bcc;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (in_stack_ffffffffffffe6d0,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
        LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::rowSet(&local_310->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                );
        local_220 = local_d4c;
        local_228 = local_49c;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  (in_stack_ffffffffffffe6d0,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
        computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)CONCAT44(in_stack_ffffffffffffecdc,in_stack_ffffffffffffecd8),
                   in_stack_ffffffffffffecd0,in_stack_ffffffffffffecc8,in_stack_ffffffffffffecc0);
        local_1a0 = local_a40;
        local_1a8 = local_ccc;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (in_stack_ffffffffffffe6d0,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
      }
      if ((in_RDI[5] != 0) && (VVar2 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 4 < (int)VVar2)) {
        local_f50 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
        local_f54 = 5;
        (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_f54);
        soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                           (char *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
        soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,in_stack_ffffffffffffe6cc);
        soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                           (char *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
        if ((local_4c5 & 1) == 0) {
          local_17f8 = local_a40;
        }
        else {
          local_17f8 = local_9b4;
        }
        local_1f0 = local_fd4;
        local_1f8 = local_17f8;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  (in_stack_ffffffffffffe6d0,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
        soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
        soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                           (char *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
        if ((local_4c5 & 1) == 0) {
          local_1818 = local_9b4;
        }
        else {
          local_1818 = local_a40;
        }
        in_stack_ffffffffffffe7d8 = local_1054;
        local_1e8 = local_1818;
        local_1e0 = in_stack_ffffffffffffe7d8;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  (in_stack_ffffffffffffe6d0,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
        in_stack_ffffffffffffe7e0 =
             (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8))
        ;
        soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                           (_func_ostream_ptr_ostream_ptr *)
                           CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
        (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_f50);
      }
      local_30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(in_RDI + 9);
      in_stack_ffffffffffffe7d0 = local_10d4;
      local_38 = &local_ac8;
      local_28 = in_stack_ffffffffffffe7d0;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_39,local_30,local_38);
      local_20 = in_stack_ffffffffffffe7d0;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffe6d0);
      local_10 = local_30;
      local_18 = local_38;
      local_8 = in_stack_ffffffffffffe7d0;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (in_stack_ffffffffffffe6d0,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8),
                 (cpp_dec_float<200U,_int,_void> *)0x753ce8);
      tVar1 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x753d01);
      local_1832 = false;
      if (tVar1) {
        local_70 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(in_RDI + 9);
        local_78 = &local_b48;
        local_68 = local_1154;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_79,local_70,local_78);
        local_60 = local_1154;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  (in_stack_ffffffffffffe6d0);
        local_50 = local_70;
        local_58 = local_78;
        local_48 = local_1154;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (in_stack_ffffffffffffe6d0,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8),
                   (cpp_dec_float<200U,_int,_void> *)0x753de7);
        local_1832 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8),
                                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)0x753e00);
      }
      if (local_1832 != false) break;
      local_170 = &local_ac8;
      local_178 = local_9b4;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (in_stack_ffffffffffffe6d0,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
      local_180 = &local_b48;
      local_188 = local_a40;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (in_stack_ffffffffffffe6d0,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
    }
    local_b0 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(in_RDI + 9);
    local_b8 = &local_548;
    local_a8 = local_11d4;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_b9,local_b0,local_b8);
    local_a0 = local_11d4;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_ffffffffffffe6d0);
    local_90 = local_b0;
    local_98 = local_b8;
    local_88 = local_11d4;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (in_stack_ffffffffffffe6d0,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8),
               (cpp_dec_float<200U,_int,_void> *)0x753f6e);
    tVar1 = boost::multiprecision::operator<=
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8),
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x753f87);
    local_1852 = true;
    if (!tVar1) {
      local_f0 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(in_RDI + 9);
      local_f8 = &local_5c8;
      local_e8 = local_1254;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_f9,local_f0,local_f8);
      local_e0 = local_1254;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffe6d0);
      local_d0 = local_f0;
      local_d8 = local_f8;
      local_c8 = local_1254;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (in_stack_ffffffffffffe6d0,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8),
                 (cpp_dec_float<200U,_int,_void> *)0x75406e);
      local_1852 = boost::multiprecision::operator<=
                             ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8),
                              (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)0x754087);
    }
    local_7d1 = local_1852;
  }
  if (((local_7d1 & 1U) == 0) && ((*(byte *)(in_RDI + 8) & 1) == 0)) {
    if ((in_RDI[5] != 0) && (VVar2 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 3 < (int)VVar2)) {
      local_1258 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
      local_125c = 4;
      (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_125c);
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                         (char *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                         (_func_ostream_ptr_ostream_ptr *)
                         CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
      (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_1258);
    }
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setScalingInfo(local_310,true);
  }
  else {
    local_1268 = in_RDI[2];
    local_1270 = in_RDI[3];
    if ((*(byte *)(in_RDI + 8) & 1) == 0) {
      SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::computeExpVec(in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8,in_stack_ffffffffffffe7d0)
      ;
      SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::computeExpVec(in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8,in_stack_ffffffffffffe7d0)
      ;
    }
    else {
      if ((local_7d1 & 1U) == 0) {
        local_1278 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)std::
                        vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::begin((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
        local_1280 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)std::
                        vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::end((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
        local_1288 = 0x3ff0000000000000;
        std::
        fill<__gnu_cxx::__normal_iterator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>*,std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>>>,double>
                  (in_stack_ffffffffffffe6e0,in_stack_ffffffffffffe6d8,
                   (double *)in_stack_ffffffffffffe6d0);
        local_1290 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)std::
                        vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::begin((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
        local_1298 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)std::
                        vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::end((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
        local_12a0 = 0x3ff0000000000000;
        std::
        fill<__gnu_cxx::__normal_iterator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>*,std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>>>,double>
                  (in_stack_ffffffffffffe6e0,in_stack_ffffffffffffe6d8,
                   (double *)in_stack_ffffffffffffe6d0);
      }
      local_1d0 = local_1320;
      local_1d8 = local_49c;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffe6d0,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
      SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::computePostequiExpVecs
                (in_stack_ffffffffffffea60,in_stack_ffffffffffffea58,in_stack_ffffffffffffea50,
                 in_stack_ffffffffffffea48,in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
    }
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_310);
    if ((in_RDI[5] != 0) && (VVar2 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 4 < (int)VVar2)) {
      SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
      (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&stack0xffffffffffffecd8);
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                         (char *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
      (**(code **)(*in_RDI + 0x188))(local_13a8);
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                         (char *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
      (**(code **)(*in_RDI + 400))(local_1428);
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                         (_func_ostream_ptr_ostream_ptr *)
                         CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                         (char *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
      (**(code **)(*in_RDI + 0x178))(local_14a8);
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                         (char *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
      (**(code **)(*in_RDI + 0x180))(local_1528);
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                         (_func_ostream_ptr_ostream_ptr *)
                         CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
      (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&stack0xffffffffffffecdc);
    }
    if ((in_RDI[5] != 0) && (VVar2 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 3 < (int)VVar2)) {
      local_152c = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
      local_1530 = 4;
      (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_1530);
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                         (char *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                         (char *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
      (*(local_310->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[3])(&stack0xffffffffffffea50,local_310,0);
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                         (char *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
      (*(local_310->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[4])(local_1630,local_310,0);
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                         (char *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
      (**(code **)(*in_RDI + 0x198))(local_16b0,in_RDI,local_310);
      in_stack_ffffffffffffe6e0._M_current =
           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                         (char *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
      (**(code **)(*in_RDI + 0x1a0))(local_1730,in_RDI,local_310);
      _spxout = soplex::operator<<((SPxOut *)in_stack_ffffffffffffe6d0,
                                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8))
      ;
      soplex::operator<<(_spxout,(_func_ostream_ptr_ostream_ptr *)
                                 CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
      (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_152c);
    }
  }
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::~vector((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             *)in_stack_ffffffffffffe6e0._M_current);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::~vector((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             *)in_stack_ffffffffffffe6e0._M_current);
  return;
}

Assistant:

void SPxGeometSC<R>::scale(SPxLPBase<R>& lp, bool persistent)
{

   SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Geometric scaling LP" <<
                 (persistent ? " (persistent)" : "") << (postequilibration ? " with post-equilibration" : "") <<
                 std::endl;)

   this->setup(lp);

   /* We want to do that direction first, with the lower ratio.
    * See SPxEquiliSC<R>::scale() for a reasoning.
    */
   const R colratio = this->maxColRatio(lp);
   const R rowratio = this->maxRowRatio(lp);
   R epsilon = this->tolerances()->epsilon();

   const bool colFirst = colratio < rowratio;

   R p0start;
   R p1start;

   if(colFirst)
   {
      p0start = colratio;
      p1start = rowratio;
   }
   else
   {
      p0start = rowratio;
      p1start = colratio;
   }

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "before scaling:"
                 << " min= " << lp.minAbsNzo()
                 << " max= " << lp.maxAbsNzo()
                 << " col-ratio= " << colratio
                 << " row-ratio= " << rowratio
                 << std::endl;)

   // perform geometric scaling only if maximum ratio is above threshold
   bool geoscale = p1start > m_goodEnoughRatio;

   if(!geoscale)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "No geometric scaling done, ratio good enough" <<
                    std::endl;)

      if(!postequilibration)
      {
         lp.setScalingInfo(true);
         return;
      }

      SPX_MSG_INFO2((*this->spxout),
                    (*this->spxout) << " ... but will still perform equilibrium scaling" <<
                    std::endl;)
   }

   std::vector<R> rowscale(unsigned(lp.nRows()), 1.0);
   std::vector<R> colscale(unsigned(lp.nCols()), 1.0);

   R p0 = 0.0;
   R p1 = 0.0;

   if(geoscale)
   {
      R p0prev = p0start;
      R p1prev = p1start;

      // we make at most maxIterations.
      for(int count = 0; count < m_maxIterations; count++)
      {
         if(colFirst)
         {
            p0 = computeScalingVec(lp.colSet(), rowscale, colscale, epsilon);
            p1 = computeScalingVec(lp.rowSet(), colscale, rowscale, epsilon);
         }
         else
         {
            p0 = computeScalingVec(lp.rowSet(), colscale, rowscale, epsilon);
            p1 = computeScalingVec(lp.colSet(), rowscale, colscale, epsilon);
         }

         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Geometric scaling round " << count
                       << " col-ratio= " << (colFirst ? p0 : p1)
                       << " row-ratio= " << (colFirst ? p1 : p0)
                       << std::endl;)

         if(p0 > m_minImprovement * p0prev && p1 > m_minImprovement * p1prev)
            break;

         p0prev = p0;
         p1prev = p1;
      }

      // perform geometric scaling only if there is enough (default 15%) improvement.
      geoscale = (p0 <= m_minImprovement * p0start || p1 <= m_minImprovement * p1start);
   }

   if(!geoscale && !postequilibration)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "No geometric scaling done." << std::endl;)
      lp.setScalingInfo(true);
   }
   else
   {
      DataArray<int>& colscaleExp = *this->m_activeColscaleExp;
      DataArray<int>& rowscaleExp = *this->m_activeRowscaleExp;

      if(postequilibration)
      {
         if(!geoscale)
         {
            std::fill(rowscale.begin(), rowscale.end(), 1.0);
            std::fill(colscale.begin(), colscale.end(), 1.0);
         }

         SPxEquiliSC<R>::computePostequiExpVecs(lp, rowscale, colscale, rowscaleExp, colscaleExp, epsilon);
      }
      else
      {
         this->computeExpVec(colscale, colscaleExp);
         this->computeExpVec(rowscale, rowscaleExp);
      }

      this->applyScaling(lp);

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Row scaling min= " << this->minAbsRowscale()
                    << " max= " << this->maxAbsRowscale()
                    << std::endl
                    << "IGEOSC06 Col scaling min= " << this->minAbsColscale()
                    << " max= " << this->maxAbsColscale()
                    << std::endl;)

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "after scaling: "
                    << " min= " << lp.minAbsNzo(false)
                    << " max= " << lp.maxAbsNzo(false)
                    << " col-ratio= " << this->maxColRatio(lp)
                    << " row-ratio= " << this->maxRowRatio(lp)
                    << std::endl;)
   }
}